

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListAppend(Parse *pParse,SrcList *pList,Token *pTable,Token *pDatabase)

{
  sqlite3 *db_00;
  char *pcVar1;
  long lVar2;
  SrcList *pNew;
  sqlite3 *db;
  SrcList_item *pItem;
  Token *pDatabase_local;
  Token *pTable_local;
  SrcList *pList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pList == (SrcList *)0x0) {
    pTable_local = (Token *)sqlite3DbMallocRawNN(pParse->db,0x78);
    if (pTable_local == (Token *)0x0) {
      return (SrcList *)0x0;
    }
    *(undefined4 *)((long)&pTable_local->z + 4) = 1;
    *(undefined4 *)&pTable_local->z = 1;
    memset(&pTable_local->n,0,0x70);
    pTable_local[4].n = 0xffffffff;
  }
  else {
    pTable_local = (Token *)sqlite3SrcListEnlarge(pParse,pList,1,pList->nSrc);
    if ((SrcList *)pTable_local == (SrcList *)0x0) {
      sqlite3SrcListDelete(db_00,pList);
      return (SrcList *)0x0;
    }
  }
  lVar2 = (long)(*(int *)&pTable_local->z + -1);
  pItem = (SrcList_item *)pDatabase;
  if ((pDatabase != (Token *)0x0) && (pDatabase->z == (char *)0x0)) {
    pItem = (SrcList_item *)0x0;
  }
  if (pItem == (SrcList_item *)0x0) {
    pcVar1 = sqlite3NameFromToken(db_00,pTable);
    *(char **)&pTable_local[lVar2 * 7 + 1].n = pcVar1;
    pTable_local[lVar2 * 7 + 1].z = (char *)0x0;
  }
  else {
    pcVar1 = sqlite3NameFromToken(db_00,(Token *)pItem);
    *(char **)&pTable_local[lVar2 * 7 + 1].n = pcVar1;
    pcVar1 = sqlite3NameFromToken(db_00,pTable);
    pTable_local[lVar2 * 7 + 1].z = pcVar1;
  }
  return (SrcList *)pTable_local;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppend(
  Parse *pParse,      /* Parsing context, in which errors are reported */
  SrcList *pList,     /* Append to this SrcList. NULL creates a new SrcList */
  Token *pTable,      /* Table to append */
  Token *pDatabase    /* Database of the table */
){
  struct SrcList_item *pItem;
  sqlite3 *db;
  assert( pDatabase==0 || pTable!=0 );  /* Cannot have C without B */
  assert( pParse!=0 );
  assert( pParse->db!=0 );
  db = pParse->db;
  if( pList==0 ){
    pList = sqlite3DbMallocRawNN(pParse->db, sizeof(SrcList) );
    if( pList==0 ) return 0;
    pList->nAlloc = 1;
    pList->nSrc = 1;
    memset(&pList->a[0], 0, sizeof(pList->a[0]));
    pList->a[0].iCursor = -1;
  }else{
    SrcList *pNew = sqlite3SrcListEnlarge(pParse, pList, 1, pList->nSrc);
    if( pNew==0 ){
      sqlite3SrcListDelete(db, pList);
      return 0;
    }else{
      pList = pNew;
    }
  }
  pItem = &pList->a[pList->nSrc-1];
  if( pDatabase && pDatabase->z==0 ){
    pDatabase = 0;
  }
  if( pDatabase ){
    pItem->zName = sqlite3NameFromToken(db, pDatabase);
    pItem->zDatabase = sqlite3NameFromToken(db, pTable);
  }else{
    pItem->zName = sqlite3NameFromToken(db, pTable);
    pItem->zDatabase = 0;
  }
  return pList;
}